

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::GetECHLength
               (SSL_CTX *ctx,size_t *out_client_hello_len,size_t *out_ech_len,size_t max_name_len,
               char *name)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  EVP_HPKE_KEM *kem;
  ulong uVar4;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  uint8_t *ech_config;
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  size_t ech_config_len;
  uint8_t *unused;
  ScopedEVP_HPKE_KEY key;
  SSL_CLIENT_HELLO parsed;
  _Head_base<0UL,_ssl_st_*,_false> local_158;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_150;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_148;
  _Head_base<0UL,_unsigned_char_*,_false> local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  size_t local_120;
  uint8_t *local_118;
  EVP_HPKE_KEY local_110;
  SSL_CLIENT_HELLO local_a0;
  
  EVP_HPKE_KEY_zero(&local_110);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar3 = EVP_HPKE_KEY_generate(&local_110,kem);
  if (iVar3 != 0) {
    iVar3 = SSL_marshal_ech_config
                      (&local_140._M_head_impl,&local_120,'\x01',&local_110,"public.example",0x80);
    if (iVar3 != 0) {
      local_148._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_140._M_head_impl;
      local_150._M_head_impl = SSL_ECH_KEYS_new();
      if (local_150._M_head_impl == (SSL_ECH_KEYS *)0x0) {
LAB_00168fae:
        bVar2 = false;
      }
      else {
        iVar3 = SSL_ECH_KEYS_add(local_150._M_head_impl,1,local_140._M_head_impl,local_120,
                                 &local_110);
        if (iVar3 == 0) goto LAB_00168fae;
        local_158._M_head_impl = (ssl_st *)SSL_new((SSL_CTX *)ctx);
        if ((SSL *)local_158._M_head_impl == (SSL *)0x0) {
LAB_00168fb2:
          bVar2 = false;
        }
        else {
          bVar2 = InstallECHConfigList(local_158._M_head_impl,local_150._M_head_impl);
          if (!bVar2) goto LAB_00168fb2;
          if (max_name_len != 0) {
            iVar3 = SSL_set_tlsext_host_name(local_158._M_head_impl,(char *)max_name_len);
            if (iVar3 == 0) goto LAB_00168fb2;
          }
          SSL_set_connect_state((SSL *)local_158._M_head_impl);
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = GetClientHello(local_158._M_head_impl,&local_138);
          puVar1 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar2) {
            uVar4 = (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            if (uVar4 < 9) {
              abort();
            }
            iVar3 = SSL_parse_client_hello
                              (local_158._M_head_impl,&local_a0,
                               local_138.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + 9,uVar4 - 9);
            if (iVar3 == 0) goto LAB_00168feb;
            iVar3 = SSL_early_callback_ctx_extension_get(&local_a0,0xfe0d,&local_118,out_ech_len);
            if (iVar3 == 0) goto LAB_00168feb;
            *out_client_hello_len = uVar4;
            bVar2 = true;
          }
          else {
LAB_00168feb:
            bVar2 = false;
          }
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1,(long)local_138.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar1);
          }
        }
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_158);
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_150);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_148);
      goto LAB_00168fd0;
    }
  }
  bVar2 = false;
LAB_00168fd0:
  EVP_HPKE_KEY_cleanup(&local_110);
  return bVar2;
}

Assistant:

static bool GetECHLength(SSL_CTX *ctx, size_t *out_client_hello_len,
                         size_t *out_ech_len, size_t max_name_len,
                         const char *name) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len,
                              /*config_id=*/1, key.get(), "public.example",
                              max_name_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return false;
  }

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx));
  if (!ssl || !InstallECHConfigList(ssl.get(), keys.get()) ||
      (name != nullptr && !SSL_set_tlsext_host_name(ssl.get(), name))) {
    return false;
  }
  SSL_set_connect_state(ssl.get());

  std::vector<uint8_t> client_hello;
  SSL_CLIENT_HELLO parsed;
  const uint8_t *unused;
  if (!GetClientHello(ssl.get(), &client_hello)) {
    return false;
  }
  // Skip record and handshake headers. This assumes the ClientHello
  // fits in one record.
  auto body =
      Span(client_hello).subspan(SSL3_RT_HEADER_LENGTH + SSL3_HM_HEADER_LENGTH);
  if (!SSL_parse_client_hello(ssl.get(), &parsed, body.data(), body.size()) ||
      !SSL_early_callback_ctx_extension_get(
          &parsed, TLSEXT_TYPE_encrypted_client_hello, &unused, out_ech_len)) {
    return false;
  }
  *out_client_hello_len = client_hello.size();
  return true;
}